

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

int hdr_percentiles_print
              (hdr_histogram *h,FILE *stream,int32_t ticks_per_half_distance,double value_scale,
              format_type format)

{
  _Bool _Var1;
  int iVar2;
  char *__format;
  int64_t iVar3;
  double dVar4;
  double dVar5;
  double max;
  double stddev;
  double mean;
  double inverted_percentile;
  int64_t total_count;
  double percentile;
  double value;
  hdr_iter_percentiles *percentiles;
  hdr_iter iter;
  int rc;
  char *head_format;
  char line_format [25];
  format_type format_local;
  double value_scale_local;
  int32_t ticks_per_half_distance_local;
  FILE *stream_local;
  hdr_histogram *h_local;
  
  iter._next_fp._4_4_ = 0;
  line_format._20_4_ = format;
  unique0x10000172 = value_scale;
  format_line_string((char *)&head_format,0x19,h->significant_figures,format);
  __format = format_head_string(line_format._20_4_);
  hdr_iter_percentile_init((hdr_iter *)&percentiles,h,ticks_per_half_distance);
  iVar2 = fprintf((FILE *)stream,__format,"Value","Percentile","TotalCount","1/(1-Percentile)");
  while( true ) {
    if (iVar2 < 0) {
      return 5;
    }
    _Var1 = hdr_iter_next((hdr_iter *)&percentiles);
    if (!_Var1) break;
    iVar2 = fprintf((FILE *)stream,(char *)&head_format,(double)iter.value / stack0xffffffffffffffd8
                    ,iter.specifics.percentiles.percentile_to_iterate_to / 100.0,
                    1.0 / (1.0 - iter.specifics.percentiles.percentile_to_iterate_to / 100.0),
                    iter.count);
  }
  if (line_format._20_4_ == 0) {
    dVar4 = hdr_mean(h);
    dVar4 = dVar4 / stack0xffffffffffffffd8;
    dVar5 = hdr_stddev(h);
    dVar5 = dVar5 / stack0xffffffffffffffd8;
    iVar3 = hdr_max(h);
    iVar2 = fprintf((FILE *)stream,
                    "#[Mean    = %12.3f, StdDeviation   = %12.3f]\n#[Max     = %12.3f, Total count    = %12lu]\n#[Buckets = %12d, SubBuckets     = %12d]\n"
                    ,dVar4,dVar5,(double)iVar3 / stack0xffffffffffffffd8,h->total_count,
                    (ulong)(uint)h->bucket_count,(ulong)(uint)h->sub_bucket_count);
    if (-1 < iVar2) {
      return iter._next_fp._4_4_;
    }
    return 5;
  }
  return iter._next_fp._4_4_;
}

Assistant:

int hdr_percentiles_print(
        struct hdr_histogram* h, FILE* stream, int32_t ticks_per_half_distance,
        double value_scale, format_type format)
{
    char line_format[25];
    const char* head_format;
    int rc = 0;
    struct hdr_iter iter;
    struct hdr_iter_percentiles * percentiles;

    format_line_string(line_format, 25, h->significant_figures, format);
    head_format = format_head_string(format);

    hdr_iter_percentile_init(&iter, h, ticks_per_half_distance);

    if (fprintf(
            stream, head_format,
            "Value", "Percentile", "TotalCount", "1/(1-Percentile)") < 0)
    {
        rc = EIO;
        goto cleanup;
    }

    percentiles = &iter.specifics.percentiles;
    while (hdr_iter_next(&iter))
    {
        double  value               = iter.highest_equivalent_value / value_scale;
        double  percentile          = percentiles->percentile / 100.0;
        int64_t total_count         = iter.cumulative_count;
        double  inverted_percentile = (1.0 / (1.0 - percentile));

        if (fprintf(
                stream, line_format, value, percentile, total_count, inverted_percentile) < 0)
        {
            rc = EIO;
            goto cleanup;
        }
    }

    if (CLASSIC == format)
    {
        double mean   = hdr_mean(h)   / value_scale;
        double stddev = hdr_stddev(h) / value_scale;
        double max    = hdr_max(h)    / value_scale;

        if (fprintf(
                stream, CLASSIC_FOOTER,  mean, stddev, max,
                h->total_count, h->bucket_count, h->sub_bucket_count) < 0)
        {
            rc = EIO;
            goto cleanup;
        }
    }

    cleanup:
    return rc;
}